

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_free.c
# Opt level: O2

void lyplg_ext_cfree_instance_substatements(ly_ctx *ctx,lysc_ext_substmt *substmts)

{
  ushort uVar1;
  ly_stmt lVar2;
  lysc_when **w;
  lysc_node *plVar3;
  ulong uVar4;
  lysc_ext_instance *plVar5;
  lysc_when *plVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  void **__ptr;
  lysc_ext_instance *ext;
  lysc_when *plVar10;
  void **ppvVar11;
  lysc_node *node;
  void *pvVar12;
  ulong uVar13;
  lysf_ctx local_50;
  
  local_50.ext_set.field_2.dnodes = (lyd_node **)0x0;
  local_50.mod = (lys_module *)0x0;
  local_50.ext_set.size = 0;
  local_50.ext_set.count = 0;
  if (substmts != (lysc_ext_substmt *)0x0) {
    local_50.ctx = ctx;
    for (ppvVar11 = (void **)0x0; ppvVar11 < substmts[-1].storage_p;
        ppvVar11 = (void **)((long)ppvVar11 + 1)) {
      w = (lysc_when **)substmts[(long)ppvVar11].storage_p;
      if (w != (lysc_when **)0x0) {
        lVar2 = substmts[(long)ppvVar11].stmt;
        if ((lVar2 - LY_STMT_NOTIFICATION < 0x40) &&
           ((0x800000008000808bU >> ((ulong)(lVar2 - LY_STMT_NOTIFICATION) & 0x3f) & 1) != 0)) {
LAB_0015b0a2:
          plVar3 = (lysc_node *)*w;
          while (node = plVar3, node != (lysc_node *)0x0) {
            plVar3 = node->next;
            uVar1 = node->nodetype;
            lysc_node_free_(&local_50,node);
            if ((uVar1 & 0x3000) != 0) {
              free(node);
            }
          }
          *substmts[(long)ppvVar11].storage_p = (void *)0x0;
        }
        else if (lVar2 != LY_STMT_AUGMENT) {
          if (((lVar2 == LY_STMT_CASE) || (lVar2 == LY_STMT_CHOICE)) || (lVar2 == LY_STMT_CONTAINER)
             ) goto LAB_0015b0a2;
          if (lVar2 != LY_STMT_GROUPING) {
            if ((lVar2 == LY_STMT_LEAF) || (lVar2 == LY_STMT_LEAF_LIST)) goto LAB_0015b0a2;
            if ((lVar2 != LY_STMT_YIN_ELEMENT) && (lVar2 != LY_STMT_USES)) {
              if (lVar2 == LY_STMT_ARGUMENT) goto LAB_0015b07c;
              if ((lVar2 != LY_STMT_BASE) && (lVar2 != LY_STMT_BELONGS_TO)) {
                if (lVar2 == LY_STMT_BIT) {
LAB_0015b0df:
                  plVar6 = *w;
                  if (plVar6 != (lysc_when *)0x0) {
                    __ptr = (void **)&plVar6[-1].refcount;
                    plVar10 = plVar6;
                    for (uVar13 = 0; uVar4._0_4_ = plVar6[-1].refcount,
                        uVar4._4_2_ = plVar6[-1].flags,
                        uVar4._6_2_ = *(undefined2 *)&plVar6[-1].field_0x36, uVar13 < uVar4;
                        uVar13 = uVar13 + 1) {
                      lysc_enum_item_free(&local_50,(lysc_type_bitenum_item *)plVar10);
                      plVar10 = (lysc_when *)&plVar10->exts;
                    }
                    goto LAB_0015b1fc;
                  }
                }
                else if (lVar2 != LY_STMT_CONFIG) {
                  if (lVar2 == LY_STMT_CONTACT) {
LAB_0015b07c:
                    lydict_remove(ctx,(char *)*w);
                  }
                  else if (lVar2 != LY_STMT_DEFAULT) {
                    if (lVar2 == LY_STMT_DESCRIPTION) goto LAB_0015b07c;
                    if ((lVar2 != LY_STMT_DEVIATE) && (lVar2 != LY_STMT_DEVIATION)) {
                      if (lVar2 == LY_STMT_ENUM) goto LAB_0015b0df;
                      if ((lVar2 == LY_STMT_ERROR_APP_TAG) || (lVar2 == LY_STMT_ERROR_MESSAGE))
                      goto LAB_0015b07c;
                      if (lVar2 != LY_STMT_EXTENSION) {
                        if (lVar2 == LY_STMT_EXTENSION_INSTANCE) {
                          plVar5 = (lysc_ext_instance *)*w;
                          if (plVar5 != (lysc_ext_instance *)0x0) {
                            __ptr = &plVar5[-1].compiled;
                            ext = plVar5;
                            for (pvVar12 = (void *)0x0; pvVar12 < plVar5[-1].compiled;
                                pvVar12 = (void *)((long)pvVar12 + 1)) {
                              lysc_ext_instance_free(&local_50,ext);
                              ext = ext + 1;
                            }
LAB_0015b1fc:
                            free(__ptr);
                          }
                        }
                        else if ((lVar2 != LY_STMT_FEATURE) && (lVar2 != LY_STMT_FRACTION_DIGITS)) {
                          if (lVar2 == LY_STMT_IDENTITY) {
                            plVar6 = *w;
                            if (plVar6 != (lysc_when *)0x0) {
                              __ptr = (void **)&plVar6[-1].refcount;
                              plVar10 = plVar6;
                              for (uVar13 = 0; uVar9._0_4_ = plVar6[-1].refcount,
                                  uVar9._4_2_ = plVar6[-1].flags,
                                  uVar9._6_2_ = *(undefined2 *)&plVar6[-1].field_0x36,
                                  uVar13 < uVar9; uVar13 = uVar13 + 1) {
                                lysc_ident_free(&local_50,(lysc_ident *)plVar10);
                                plVar10 = plVar10 + 1;
                              }
                              goto LAB_0015b1fc;
                            }
                          }
                          else if (((lVar2 != LY_STMT_IF_FEATURE) && (lVar2 != LY_STMT_IMPORT)) &&
                                  (lVar2 != LY_STMT_INCLUDE)) {
                            if (lVar2 == LY_STMT_KEY) goto LAB_0015b07c;
                            if (lVar2 == LY_STMT_LENGTH) {
LAB_0015b113:
                              lysc_range_free(&local_50,(lysc_range *)*w);
                            }
                            else if (((lVar2 != LY_STMT_MANDATORY) &&
                                     (lVar2 != LY_STMT_MAX_ELEMENTS)) &&
                                    (lVar2 != LY_STMT_MIN_ELEMENTS)) {
                              if (lVar2 == LY_STMT_MODIFIER) goto LAB_0015b07c;
                              if (lVar2 != LY_STMT_MODULE) {
                                if (lVar2 == LY_STMT_MUST) {
                                  plVar6 = *w;
                                  if (plVar6 != (lysc_when *)0x0) {
                                    __ptr = (void **)&plVar6[-1].refcount;
                                    plVar10 = plVar6;
                                    for (uVar13 = 0; uVar8._0_4_ = plVar6[-1].refcount,
                                        uVar8._4_2_ = plVar6[-1].flags,
                                        uVar8._6_2_ = *(undefined2 *)&plVar6[-1].field_0x36,
                                        uVar13 < uVar8; uVar13 = uVar13 + 1) {
                                      lysc_must_free(&local_50,(lysc_must *)plVar10);
                                      plVar10 = plVar10 + 1;
                                    }
                                    goto LAB_0015b1fc;
                                  }
                                }
                                else {
                                  if (lVar2 == LY_STMT_NAMESPACE) goto LAB_0015b07c;
                                  if (lVar2 != LY_STMT_ORDERED_BY) {
                                    if (lVar2 == LY_STMT_ORGANIZATION) goto LAB_0015b07c;
                                    if (lVar2 != LY_STMT_PATH) {
                                      if (lVar2 == LY_STMT_PATTERN) {
                                        plVar6 = *w;
                                        if (plVar6 != (lysc_when *)0x0) {
                                          __ptr = (void **)&plVar6[-1].refcount;
                                          plVar10 = plVar6;
                                          for (uVar13 = 0; uVar7._0_4_ = plVar6[-1].refcount,
                                              uVar7._4_2_ = plVar6[-1].flags,
                                              uVar7._6_2_ = *(undefined2 *)&plVar6[-1].field_0x36,
                                              uVar13 < uVar7; uVar13 = uVar13 + 1) {
                                            lysc_pattern_free(&local_50,(lysc_pattern **)plVar10);
                                            plVar10 = (lysc_when *)&plVar10->context;
                                          }
                                          goto LAB_0015b1fc;
                                        }
                                      }
                                      else if ((lVar2 != LY_STMT_POSITION) &&
                                              (lVar2 != LY_STMT_PREFIX)) {
                                        if (lVar2 != LY_STMT_PRESENCE) {
                                          if (lVar2 == LY_STMT_RANGE) goto LAB_0015b113;
                                          if (lVar2 != LY_STMT_REFERENCE) {
                                            if (((((lVar2 != LY_STMT_REFINE) &&
                                                  (lVar2 != LY_STMT_REQUIRE_INSTANCE)) &&
                                                 (lVar2 != LY_STMT_REVISION)) &&
                                                ((lVar2 != LY_STMT_REVISION_DATE &&
                                                 (lVar2 != LY_STMT_STATUS)))) &&
                                               (lVar2 != LY_STMT_SUBMODULE)) {
                                              if (lVar2 == LY_STMT_TYPE) {
                                                lysc_type_free(&local_50,(lysc_type *)*w);
                                              }
                                              else if ((lVar2 != LY_STMT_TYPEDEF) &&
                                                      (lVar2 != LY_STMT_UNIQUE)) {
                                                if (lVar2 == LY_STMT_UNITS) goto LAB_0015b07c;
                                                if (lVar2 != LY_STMT_VALUE) {
                                                  if (lVar2 == LY_STMT_WHEN) {
                                                    lysc_when_free(&local_50,w);
                                                  }
                                                  else if (lVar2 != LY_STMT_YANG_VERSION) {
                                                    if (lVar2 == LY_STMT_LIST) goto LAB_0015b0a2;
                                                    ly_log(ctx,LY_LLERR,LY_EINT,
                                                           "Internal error (%s:%d).",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_schema_free.c"
                                                  ,0x6a2);
                                                  }
                                                }
                                              }
                                            }
                                            goto LAB_0015b20d;
                                          }
                                        }
                                        goto LAB_0015b07c;
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
LAB_0015b20d:
    }
    free(&substmts[-1].storage_p);
  }
  return;
}

Assistant:

LIBYANG_API_DEF void
lyplg_ext_cfree_instance_substatements(const struct ly_ctx *ctx, struct lysc_ext_substmt *substmts)
{
    LY_ARRAY_COUNT_TYPE u;
    struct lysf_ctx fctx = {.ctx = (struct ly_ctx *)ctx};
    ly_bool node_free;

    LY_ARRAY_FOR(substmts, u) {
        if (!substmts[u].storage_p) {
            continue;
        }

        switch (substmts[u].stmt) {
        case LY_STMT_NOTIFICATION:
        case LY_STMT_INPUT:
        case LY_STMT_OUTPUT:
        case LY_STMT_ACTION:
        case LY_STMT_RPC:
        case LY_STMT_ANYDATA:
        case LY_STMT_ANYXML:
        case LY_STMT_CASE:
        case LY_STMT_CHOICE:
        case LY_STMT_CONTAINER:
        case LY_STMT_LEAF:
        case LY_STMT_LEAF_LIST:
        case LY_STMT_LIST: {
            struct lysc_node *child, *child_next;

            LY_LIST_FOR_SAFE(*substmts[u].storage_p, child_next, child) {
                node_free = (child->nodetype & (LYS_INPUT | LYS_OUTPUT)) ? 1 : 0;
                lysc_node_free_(&fctx, child);
                if (node_free) {
                    free(child);
                }
            }
            *substmts[u].storage_p = NULL;
            break;
        }
        case LY_STMT_USES:
        case LY_STMT_CONFIG:
        case LY_STMT_FRACTION_DIGITS:
        case LY_STMT_MANDATORY:
        case LY_STMT_MAX_ELEMENTS:
        case LY_STMT_MIN_ELEMENTS:
        case LY_STMT_ORDERED_BY:
        case LY_STMT_POSITION:
        case LY_STMT_REQUIRE_INSTANCE:
        case LY_STMT_STATUS:
        case LY_STMT_VALUE:
            /* nothing to do */
            break;

        case LY_STMT_ARGUMENT:
        case LY_STMT_CONTACT:
        case LY_STMT_DESCRIPTION:
        case LY_STMT_ERROR_APP_TAG:
        case LY_STMT_ERROR_MESSAGE:
        case LY_STMT_KEY:
        case LY_STMT_MODIFIER:
        case LY_STMT_NAMESPACE:
        case LY_STMT_ORGANIZATION:
        case LY_STMT_PRESENCE:
        case LY_STMT_REFERENCE:
        case LY_STMT_UNITS: {
            /* single item */
            const char *str = *substmts[u].storage_p;

            lydict_remove(ctx, str);
            break;
        }
        case LY_STMT_BIT:
        case LY_STMT_ENUM: {
            /* sized array */
            struct lysc_type_bitenum_item *items = *substmts[u].storage_p;

            FREE_ARRAY(&fctx, items, lysc_enum_item_free);
            break;
        }
        case LY_STMT_LENGTH:
        case LY_STMT_RANGE: {
            /* single item */
            struct lysc_range *range = *substmts[u].storage_p;

            lysc_range_free(&fctx, range);
            break;
        }
        case LY_STMT_MUST: {
            /* sized array */
            struct lysc_must *musts = *substmts[u].storage_p;

            FREE_ARRAY(&fctx, musts, lysc_must_free);
            break;
        }
        case LY_STMT_WHEN:
            /* single item, expects a pointer */
            lysc_when_free(&fctx, (struct lysc_when **)substmts[u].storage_p);
            break;

        case LY_STMT_PATTERN: {
            /* sized array of pointers */
            struct lysc_pattern **patterns = *substmts[u].storage_p;

            FREE_ARRAY(&fctx, patterns, lysc_pattern_free);
            break;
        }
        case LY_STMT_TYPE: {
            /* single item */
            struct lysc_type *type = *substmts[u].storage_p;

            lysc_type_free(&fctx, type);
            break;
        }
        case LY_STMT_IDENTITY: {
            /* sized array */
            struct lysc_ident *idents = *substmts[u].storage_p;

            FREE_ARRAY(&fctx, idents, lysc_ident_free);
            break;
        }
        case LY_STMT_EXTENSION_INSTANCE: {
            /* sized array */
            struct lysc_ext_instance *exts = *substmts[u].storage_p;

            FREE_ARRAY(&fctx, exts, lysc_ext_instance_free);
            break;
        }
        case LY_STMT_AUGMENT:
        case LY_STMT_BASE:
        case LY_STMT_BELONGS_TO:
        case LY_STMT_DEFAULT:
        case LY_STMT_DEVIATE:
        case LY_STMT_DEVIATION:
        case LY_STMT_EXTENSION:
        case LY_STMT_FEATURE:
        case LY_STMT_GROUPING:
        case LY_STMT_IF_FEATURE:
        case LY_STMT_IMPORT:
        case LY_STMT_INCLUDE:
        case LY_STMT_MODULE:
        case LY_STMT_PATH:
        case LY_STMT_PREFIX:
        case LY_STMT_REFINE:
        case LY_STMT_REVISION:
        case LY_STMT_REVISION_DATE:
        case LY_STMT_SUBMODULE:
        case LY_STMT_TYPEDEF:
        case LY_STMT_UNIQUE:
        case LY_STMT_YANG_VERSION:
        case LY_STMT_YIN_ELEMENT:
            /* it is not possible to compile these statements */
            break;

        default:
            LOGINT(ctx);
        }
    }

    LY_ARRAY_FREE(substmts);
}